

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O2

IterateResult __thiscall glcts::GeometryShaderAdjacency::iterate(GeometryShaderAdjacency *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  long lVar8;
  ostream *poVar9;
  MessageBuilder *pMVar10;
  AdjacencyTestData *pAVar11;
  ulong uVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  char *local_4e0 [4];
  stringstream sstreamExpected;
  ostream local_4b0;
  undefined1 local_338 [384];
  stringstream sstreamResult;
  ostream local_1a8;
  long lVar7;
  
  initTest(this);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0xd8))(this->m_vao_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x163);
  if (this->m_test_data->m_gs_code == (char *)0x0) {
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->m_geometry_bo_id);
  }
  else {
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,this->m_adjacency_geometry_bo_id);
    (**(code **)(lVar7 + 0x48))(0x8c8e,1,this->m_geometry_bo_id);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error configuring transform feedback buffer binding points!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x170);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_vertex_data_bo_id);
  GVar6 = (**(code **)(lVar7 + 0x780))(this->m_po_id,"position_data");
  this->m_position_attribute_location = GVar6;
  (**(code **)(lVar7 + 0x19f0))(GVar6,this->m_components_input,0x1406,0,0,0);
  (**(code **)(lVar7 + 0x610))(this->m_position_attribute_location);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error setting vertex attribute array for position_data attribute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x176);
  if (this->m_test_data->m_index_data_bo_size != 0) {
    (**(code **)(lVar7 + 0x40))(0x8893,this->m_index_data_bo_id);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error binding index data buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x17d);
  (**(code **)(lVar7 + 0x5e0))(0x8c89);
  (**(code **)(lVar7 + 0x1680))(this->m_po_id);
  (**(code **)(lVar7 + 0x30))(this->m_test_data->m_tf_mode);
  pAVar11 = this->m_test_data;
  GVar2 = pAVar11->m_mode;
  if (pAVar11->m_index_data_bo_size == 0) {
    (**(code **)(lVar7 + 0x538))(GVar2,0);
  }
  else {
    (**(code **)(lVar7 + 0x568))
              (GVar2,pAVar11->m_n_vertices <<
                     (GVar2 != (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY &&
                     GVar2 != (this->super_TestCaseBase).m_glExtTokens.LINE_STRIP_ADJACENCY),0x1405,
               0);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Error while trying to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x193);
  (**(code **)(lVar7 + 0x4e8))(0x8c89);
  (**(code **)(lVar7 + 0x638))();
  if (this->m_test_data->m_gs_code == (char *)0x0) {
LAB_00d50aa1:
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_geometry_bo_id);
    lVar8 = (**(code **)(lVar7 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error when mapping data to client space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x1cc);
    std::__cxx11::stringstream::stringstream((stringstream *)&sstreamExpected);
    std::__cxx11::stringstream::stringstream((stringstream *)&sstreamResult);
    std::operator<<(&local_4b0,"[");
    std::operator<<(&local_1a8,"[");
    pAVar11 = this->m_test_data;
    uVar3 = 0;
    do {
      uVar12 = uVar3;
      if (pAVar11->m_geometry_bo_size >> 2 <= uVar12) {
        std::operator<<(&local_4b0,"]");
        std::operator<<(&local_1a8,"]");
        local_338._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Expected: ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_4e0[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_4e0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        local_338._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Result:  ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_4e0[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_4e0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        (**(code **)(lVar7 + 0x1670))(0x8c8e);
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        goto LAB_00d50e0e;
      }
      poVar9 = (ostream *)std::ostream::operator<<(&local_4b0,pAVar11->m_expected_geometry[uVar12]);
      std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(&local_1a8,*(float *)(lVar8 + uVar12 * 4));
      std::operator<<(poVar9,", ");
      pfVar13 = (float *)(uVar12 * 4 + lVar8);
      pAVar11 = this->m_test_data;
      fVar14 = *pfVar13 - pAVar11->m_expected_geometry[uVar12];
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      uVar3 = uVar12 + 1;
    } while (fVar15 < this->m_epsilon);
    (**(code **)(lVar7 + 0x1670))(0x8c8e);
    local_338._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_338 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"At [");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,
                    "] position geometry buffer position Reference value is different than the rendered data (epsilon "
                   );
    pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,&this->m_epsilon);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>," )");
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>," (");
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,this->m_test_data->m_expected_geometry + uVar12);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,") vs ");
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"(");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar13);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_adjacency_geometry_bo_id);
    lVar8 = (**(code **)(lVar7 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error when mapping data to client space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x1a2);
    std::__cxx11::stringstream::stringstream((stringstream *)&sstreamExpected);
    std::__cxx11::stringstream::stringstream((stringstream *)&sstreamResult);
    std::operator<<(&local_4b0,"[");
    std::operator<<(&local_1a8,"[");
    pAVar11 = this->m_test_data;
    uVar3 = 0;
    do {
      uVar12 = uVar3;
      if (pAVar11->m_geometry_bo_size >> 2 <= uVar12) {
        std::operator<<(&local_4b0,"]");
        std::operator<<(&local_1a8,"]");
        local_338._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Adjacency Expected: ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_4e0[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_4e0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        local_338._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_338 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Adjacency Result:  ");
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)poVar1,local_4e0[0]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)local_4e0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        (**(code **)(lVar7 + 0x1670))(0x8c8e);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstreamResult);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstreamExpected);
        goto LAB_00d50aa1;
      }
      poVar9 = (ostream *)
               std::ostream::operator<<(&local_4b0,pAVar11->m_expected_adjacency_geometry[uVar12]);
      std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(&local_1a8,*(float *)(lVar8 + uVar12 * 4));
      std::operator<<(poVar9,", ");
      pfVar13 = (float *)(uVar12 * 4 + lVar8);
      pAVar11 = this->m_test_data;
      fVar14 = *pfVar13 - pAVar11->m_expected_adjacency_geometry[uVar12];
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      uVar3 = uVar12 + 1;
    } while (fVar15 < this->m_epsilon);
    (**(code **)(lVar7 + 0x1670))(0x8c8e);
    local_338._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_338 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"At [");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,
                    "] position adjacency buffer position Reference value is different than the rendered data (epsilon "
                   );
    pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,&this->m_epsilon);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>," )");
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>," (");
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,this->m_test_data->m_expected_adjacency_geometry + uVar12);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,") vs ");
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"(");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar13);
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
LAB_00d50e0e:
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstreamResult);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstreamExpected);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderAdjacency::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Bind buffer objects used as data store for transform feedback to TF binding points*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_adjacency_geometry_bo_id);
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_geometry_bo_id);
	}
	else
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_geometry_bo_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring transform feedback buffer binding points!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_data_bo_id);
	m_position_attribute_location = gl.getAttribLocation(m_po_id, "position_data");
	gl.vertexAttribPointer(m_position_attribute_location, m_components_input, GL_FLOAT, GL_FALSE, 0, 0);
	gl.enableVertexAttribArray(m_position_attribute_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting vertex attribute array for position_data attribute");

	/* bind index buffer */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_data_bo_id);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding index data buffer");

	/* Configure program */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.useProgram(m_po_id);
	gl.beginTransformFeedback(m_test_data.m_tf_mode);

	glw::GLuint nVertices = m_test_data.m_n_vertices * ((m_test_data.m_mode == m_glExtTokens.LINE_STRIP_ADJACENCY ||
														 m_test_data.m_mode == m_glExtTokens.TRIANGLE_STRIP_ADJACENCY) ?
															1 :
															2 /* include adjacency info */);

	/* Use glDrawElements if data is indicied */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.drawElements(m_test_data.m_mode, nVertices, GL_UNSIGNED_INT, 0);
	}
	/* Use glDrawArrays if data is non indicied */
	else
	{
		gl.drawArrays(m_test_data.m_mode, 0, nVertices);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error while trying to render");

	gl.disable(GL_RASTERIZER_DISCARD);
	gl.endTransformFeedback();

	/* Map result buffer objects into client space */
	float* result_adjacency_geometry_ptr = 0;
	float* result_geometry_ptr			 = 0;

	/* If gs is available read adjacency data using TF and compare with expected data*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_adjacency_geometry_bo_id);
		result_adjacency_geometry_ptr =
			(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

		std::stringstream sstreamExpected;
		std::stringstream sstreamResult;
		sstreamExpected << "[";
		sstreamResult << "[";

		for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
		{
			sstreamExpected << m_test_data.m_expected_adjacency_geometry[n] << ", ";
			sstreamResult << result_adjacency_geometry_ptr[n] << ", ";

			if (de::abs(result_adjacency_geometry_ptr[n] - m_test_data.m_expected_adjacency_geometry[n]) >= m_epsilon)
			{
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				m_testCtx.getLog() << tcu::TestLog::Message << "At [" << n
								   << "] position adjacency buffer position Reference value is different than the "
									  "rendered data (epsilon "
								   << m_epsilon << " )"
								   << " (" << m_test_data.m_expected_adjacency_geometry[n] << ") vs "
								   << "(" << result_adjacency_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}

		sstreamExpected << "]";
		sstreamResult << "]";
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Expected: " << sstreamExpected.str().c_str()
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Result:  " << sstreamResult.str().c_str()
						   << tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	/* Read vertex data using TF and compare with expected data*/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_geometry_bo_id);
	result_geometry_ptr =
		(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

	std::stringstream sstreamExpected;
	std::stringstream sstreamResult;
	sstreamExpected << "[";
	sstreamResult << "[";

	for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
	{
		sstreamExpected << m_test_data.m_expected_geometry[n] << ", ";
		sstreamResult << result_geometry_ptr[n] << ", ";

		if (de::abs(result_geometry_ptr[n] - m_test_data.m_expected_geometry[n]) >= m_epsilon)
		{
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "At [" << n
				<< "] position geometry buffer position Reference value is different than the rendered data (epsilon "
				<< m_epsilon << " )"
				<< " (" << m_test_data.m_expected_geometry[n] << ") vs "
				<< "(" << result_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	sstreamExpected << "]";
	sstreamResult << "]";
	m_testCtx.getLog() << tcu::TestLog::Message << "Expected: " << sstreamExpected.str().c_str()
					   << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Result:  " << sstreamResult.str().c_str()
					   << tcu::TestLog::EndMessage;

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}